

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int countint(TValue *key,int *nums)

{
  uint x;
  int iVar1;
  int k;
  int *nums_local;
  TValue *key_local;
  
  x = arrayindex(key);
  if (((int)x < 1) || (0x40000000 < (int)x)) {
    key_local._4_4_ = 0;
  }
  else {
    iVar1 = luaO_ceillog2(x);
    nums[iVar1] = nums[iVar1] + 1;
    key_local._4_4_ = 1;
  }
  return key_local._4_4_;
}

Assistant:

static int countint (const TValue *key, int *nums) {
  int k = arrayindex(key);
  if (0 < k && k <= MAXASIZE) {  /* is `key' an appropriate array index? */
    nums[luaO_ceillog2(k)]++;  /* count as such */
    return 1;
  }
  else
    return 0;
}